

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O2

int Rpo_CheckORGroup(Literal_t *lit1,Literal_t *lit2,int nVars)

{
  int iVar1;
  uint *pOut;
  uint *pOut_00;
  
  iVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    iVar1 = 1;
  }
  pOut = (uint *)malloc((long)iVar1 << 2);
  pOut_00 = (uint *)malloc((long)iVar1 << 2);
  Kit_TruthAnd(pOut,lit1->transition,lit2->function,nVars);
  iVar1 = Kit_TruthIsConst0(pOut,nVars);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    Kit_TruthAnd(pOut_00,lit2->transition,lit1->function,nVars);
    iVar1 = Kit_TruthIsConst0(pOut_00,nVars);
  }
  free(pOut);
  free(pOut_00);
  return iVar1;
}

Assistant:

int Rpo_CheckORGroup(Literal_t* lit1, Literal_t* lit2, int nVars) {
    unsigned* and1 = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    unsigned* and2 = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    int isZero;
    Kit_TruthAnd(and1, lit1->transition, lit2->function, nVars);
    isZero = Kit_TruthIsConst0(and1, nVars);
    if (isZero) {
        Kit_TruthAnd(and2, lit2->transition, lit1->function, nVars);
        isZero = Kit_TruthIsConst0(and2, nVars);
    }
    ABC_FREE(and1);
    ABC_FREE(and2);
    return isZero;
}